

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::Attack(Player *this,Player *target,string *prov)

{
  pointer pcVar1;
  int ap;
  int dp;
  Type TVar2;
  int iVar3;
  Personality *this_00;
  long lVar4;
  DynastyDeck *this_01;
  char *pcVar5;
  DynastyDeck *this_02;
  string local_50;
  
  pcVar1 = (prov->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + prov->_M_string_length);
  this_00 = (Personality *)DynastyDeck::findTarget(&target->provinces,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this_00 == (Personality *)0x0) {
    pcVar5 = "Invalid target province";
    lVar4 = 0x17;
  }
  else {
    this_01 = &this->army;
    ap = DynastyDeck::calculateAttackPoints(this_01);
    this_02 = &target->army;
    dp = DynastyDeck::calculateDefensePoints(this_02);
    TVar2 = Card::getType((Card *)this_00);
    if (TVar2 == PERSONALITY) {
      iVar3 = Personality::getDefense(this_00);
      dp = dp + iVar3;
    }
    if (dp < ap) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Attack successful",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      DynastyDeck::popCard(&target->provinces,(BlackCard *)this_00);
      Card::getType((Card *)this_00);
      (*(this_00->super_BlackCard).super_Card._vptr_Card[3])(this_00);
      DynastyDeck::BattleConsequences(this_02,false,false,ap,dp);
      DynastyDeck::BattleConsequences(this_01,true,true,ap,dp);
      (*(this_00->super_BlackCard).super_Card._vptr_Card[3])(this_00);
      pcVar5 = "Province destroyed";
      lVar4 = 0x12;
    }
    else if (ap == dp) {
      DynastyDeck::BattleConsequences(this_02,false,false,ap,ap);
      DynastyDeck::BattleConsequences(this_01,true,false,ap,ap);
      pcVar5 = "Draw";
      lVar4 = 4;
    }
    else {
      DynastyDeck::BattleConsequences(this_02,false,true,ap,dp);
      DynastyDeck::BattleConsequences(this_01,true,false,ap,dp);
      pcVar5 = "Attack unsuccessful";
      lVar4 = 0x13;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

void Player::Attack(Player * target, string prov)
{
    list<BlackCard*>::iterator it;

    Personality * pers;
    Item * item;

    BlackCard *prTarget = target->provinces.findTarget(prov);
    if (!prTarget)
    {
        cout << "Invalid target province"<<endl;
        return;
    }

    int ap = army.calculateAttackPoints();
    int dp = target->army.calculateDefensePoints();        //without provinces initial defense

    if (prTarget->getType() == Card::PERSONALITY) //all followers and items associated with personalities are deleted by their constructor
    {
        pers = reinterpret_cast<Personality *>(prTarget);
        dp += pers->getDefense();
    }

    if (ap > dp)
    {
        cout << "Attack successful"<<endl;

        //destroy province of target
        target->provinces.popCard(prTarget);

        if (prTarget->getType() == Card::PERSONALITY)
            delete pers;
        else
            delete item;

        target->army.BattleConsequences(false, false, ap, dp);                   //destroy associated army of target
        this->army.BattleConsequences(true, true, ap, dp);                       //change attacking army

        delete prTarget;
        cout << "Province destroyed"<<endl;
    }
    else if (ap == dp)
    {
        //destroy all attacking and defending armies
        target->army.BattleConsequences(false, false, ap, dp);
        this->army.BattleConsequences(true, false, ap, dp);
        cout << "Draw"<<endl;
    }
    else
    {
        target->army.BattleConsequences(false, true, ap, dp);                   //change associated army of target
        this->army.BattleConsequences(true, false, ap, dp);                     //destroy attacking army
        cout << "Attack unsuccessful"<<endl;
    }
}